

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O3

void __thiscall adios2::core::engine::BP5Writer::FlushProfiler(BP5Writer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  int iVar4;
  long *plVar5;
  size_type *psVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bpTargetNames;
  vector<char,_std::allocator<char>_> profilingJSON;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transportTypes;
  string profileFileName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bpBaseNames;
  string lineJSON;
  vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
  transportProfilersMD;
  vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
  transportProfilers;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transportTypesMD;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  allocator_type local_439;
  undefined1 local_438 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_400;
  string local_3e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3c8;
  string local_3b0;
  vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_> local_390;
  vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_> local_378;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_360;
  FileFStream local_348;
  
  transportman::TransportMan::GetTransportsTypes_abi_cxx11_(&local_400,&this->m_FileDataManager);
  if (local_400.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_400.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar7 = 0xffffffff;
  }
  else {
    uVar7 = 0xffffffff;
    lVar8 = 0;
    uVar9 = 0;
    do {
      iVar4 = std::__cxx11::string::compare
                        ((long)&((local_400.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar8,0,(char *)0x4);
      if (iVar4 == 0) {
        uVar7 = uVar9 & 0xffffffff;
      }
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x20;
    } while (uVar9 < (ulong)((long)local_400.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_400.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  transportman::TransportMan::GetTransportsProfilers(&local_378,&this->m_FileDataManager);
  transportman::TransportMan::GetTransportsTypes_abi_cxx11_(&local_360,&this->m_FileMetadataManager)
  ;
  transportman::TransportMan::GetTransportsProfilers(&local_390,&this->m_FileMetadataManager);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_400,
             local_400.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             local_360.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_360.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::vector<adios2::profiling::IOChrono*,std::allocator<adios2::profiling::IOChrono*>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<adios2::profiling::IOChrono**,std::vector<adios2::profiling::IOChrono*,std::allocator<adios2::profiling::IOChrono*>>>>
            ((vector<adios2::profiling::IOChrono*,std::allocator<adios2::profiling::IOChrono*>> *)
             &local_378,
             local_378.
             super__Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             local_390.
             super__Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_390.
             super__Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  profiling::JSONProfiler::GetRankProfilingJSON
            ((string *)&local_348,&this->m_Profiler,&local_400,&local_378);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_348);
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_3b0.field_2._M_allocated_capacity = *psVar6;
    local_3b0.field_2._8_8_ = plVar5[3];
    local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  }
  else {
    local_3b0.field_2._M_allocated_capacity = *psVar6;
    local_3b0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_3b0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  psVar6 = &local_348.super_Transport.m_Type._M_string_length;
  if (local_348.super_Transport._vptr_Transport != (_func_int **)psVar6) {
    operator_delete(local_348.super_Transport._vptr_Transport);
  }
  profiling::JSONProfiler::AggregateProfilingJSON
            ((vector<char,_std::allocator<char>_> *)&local_418,&this->m_Profiler,&local_3b0);
  if ((this->super_BP5Engine).m_RankMPI == 0) {
    paVar1 = &local_3e8.field_2;
    local_3e8._M_string_length = 0;
    local_3e8.field_2._M_local_buf[0] = '\0';
    local_3e8._M_dataplus._M_p = (pointer)paVar1;
    if (this->m_DrainBB == true) {
      pcVar3 = (this->super_Engine).m_Name._M_dataplus._M_p;
      local_348.super_Transport._vptr_Transport = (_func_int **)psVar6;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_348,pcVar3,pcVar3 + (this->super_Engine).m_Name._M_string_length);
      __l._M_len = 1;
      __l._M_array = (iterator)&local_348;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_438,__l,(allocator_type *)&local_3c8);
      if (local_348.super_Transport._vptr_Transport != (_func_int **)psVar6) {
        operator_delete(local_348.super_Transport._vptr_Transport);
      }
      if ((int)uVar7 < 0) {
        local_348.super_Transport._vptr_Transport = (_func_int **)psVar6;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_348,*(long *)local_438._0_8_,
                   *(size_type *)(local_438._0_8_ + 8) + *(long *)local_438._0_8_);
        std::__cxx11::string::append((char *)&local_348);
      }
      else {
        local_348.super_Transport._vptr_Transport = (_func_int **)psVar6;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_348,*(long *)(local_438._0_8_ + uVar7 * 0x20),
                   *(long *)(local_438._0_8_ + uVar7 * 0x20 + 8) +
                   *(long *)(local_438._0_8_ + uVar7 * 0x20));
        std::__cxx11::string::append((char *)&local_348);
      }
      std::__cxx11::string::operator=((string *)&local_3e8,(string *)&local_348);
      if (local_348.super_Transport._vptr_Transport != (_func_int **)psVar6) {
        operator_delete(local_348.super_Transport._vptr_Transport);
      }
      burstbuffer::FileDrainer::AddOperationWrite
                (&(this->m_FileDrainer).super_FileDrainer,&local_3e8,
                 local_418._8_8_ - local_418._0_8_,(void *)local_418._M_allocated_capacity);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_438);
    }
    else {
      transport::FileFStream::FileFStream(&local_348,&(this->super_Engine).m_Comm);
      pbVar2 = (pointer)(local_438 + 0x10);
      pcVar3 = (this->super_Engine).m_Name._M_dataplus._M_p;
      local_438._0_8_ = pbVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_438,pcVar3,pcVar3 + (this->super_Engine).m_Name._M_string_length);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)local_438;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_3c8,__l_00,&local_439);
      if ((pointer)local_438._0_8_ != pbVar2) {
        operator_delete((void *)local_438._0_8_);
      }
      if ((int)uVar7 < 0) {
        pcVar3 = ((local_3c8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        local_438._0_8_ = pbVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_438,pcVar3,
                   pcVar3 + (local_3c8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
        std::__cxx11::string::append(local_438);
      }
      else {
        pcVar3 = local_3c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_dataplus._M_p;
        local_438._0_8_ = pbVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_438,pcVar3,
                   pcVar3 + local_3c8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_string_length);
        std::__cxx11::string::append(local_438);
      }
      std::__cxx11::string::operator=((string *)&local_3e8,(string *)local_438);
      if ((pointer)local_438._0_8_ != pbVar2) {
        operator_delete((void *)local_438._0_8_);
      }
      transport::FileFStream::Open(&local_348,&local_3e8,Write,false,false);
      transport::FileFStream::Write
                (&local_348,(char *)local_418._M_allocated_capacity,
                 local_418._8_8_ - local_418._0_8_,0xffffffffffffffff);
      transport::FileFStream::Close(&local_348);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_3c8);
      transport::FileFStream::~FileFStream(&local_348);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_3e8._M_dataplus._M_p);
    }
  }
  if ((char *)local_418._M_allocated_capacity != (char *)0x0) {
    operator_delete((void *)local_418._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  if (local_390.
      super__Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_390.
                    super__Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_360);
  if (local_378.
      super__Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_378.
                    super__Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_400);
  return;
}

Assistant:

void BP5Writer::FlushProfiler()
{
    auto transportTypes = m_FileDataManager.GetTransportsTypes();

    // find first File type output, where we can write the profile
    int fileTransportIdx = -1;
    for (size_t i = 0; i < transportTypes.size(); ++i)
    {
        if (transportTypes[i].compare(0, 4, "File") == 0)
        {
            fileTransportIdx = static_cast<int>(i);
        }
    }

    auto transportProfilers = m_FileDataManager.GetTransportsProfilers();

    auto transportTypesMD = m_FileMetadataManager.GetTransportsTypes();
    auto transportProfilersMD = m_FileMetadataManager.GetTransportsProfilers();

    transportTypes.insert(transportTypes.end(), transportTypesMD.begin(), transportTypesMD.end());

    transportProfilers.insert(transportProfilers.end(), transportProfilersMD.begin(),
                              transportProfilersMD.end());

    // m_Profiler.WriteOut(transportTypes, transportProfilers);

    const std::string lineJSON(m_Profiler.GetRankProfilingJSON(transportTypes, transportProfilers) +
                               ",\n");

    const std::vector<char> profilingJSON(m_Profiler.AggregateProfilingJSON(lineJSON));

    if (m_RankMPI == 0)
    {
        // std::cout << "write profiling file!" << std::endl;
        std::string profileFileName;
        if (m_DrainBB)
        {
            // auto bpTargetNames =
            // m_BP4Serializer.GetBPBaseNames({m_Name});
            std::vector<std::string> bpTargetNames = {m_Name};
            if (fileTransportIdx > -1)
            {
                profileFileName = bpTargetNames[fileTransportIdx] + "/profiling.json";
            }
            else
            {
                profileFileName = bpTargetNames[0] + "_profiling.json";
            }
            m_FileDrainer.AddOperationWrite(profileFileName, profilingJSON.size(),
                                            profilingJSON.data());
        }
        else
        {
            transport::FileFStream profilingJSONStream(m_Comm);
            // auto bpBaseNames =
            // m_BP4Serializer.GetBPBaseNames({m_BBName});
            std::vector<std::string> bpBaseNames = {m_Name};
            if (fileTransportIdx > -1)
            {
                profileFileName = bpBaseNames[fileTransportIdx] + "/profiling.json";
            }
            else
            {
                profileFileName = bpBaseNames[0] + "_profiling.json";
            }
            profilingJSONStream.Open(profileFileName, Mode::Write);
            profilingJSONStream.Write(profilingJSON.data(), profilingJSON.size());
            profilingJSONStream.Close();
        }
    }
}